

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MediaManager.cpp
# Opt level: O0

void __thiscall MediaManager::Init(MediaManager *this)

{
  bool bVar1;
  Disk *this_00;
  value_type pIVar2;
  value_type local_90;
  value_type local_88;
  value_type local_80;
  value_type local_78;
  value_type local_70;
  Disk *local_68 [3];
  int local_4c;
  reference ppIStack_48;
  int type;
  IContainedElement **list_of_element;
  iterator __end1;
  iterator __begin1;
  vector<IContainedElement_*,_std::allocator<IContainedElement_*>_> *__range1;
  vector<IContainedElement_*,_std::allocator<IContainedElement_*>_> list_of_elements;
  MediaManager *this_local;
  
  list_of_elements.super__Vector_base<IContainedElement_*,_std::allocator<IContainedElement_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  ClearList(this);
  DataContainer::GetFileList
            ((vector<IContainedElement_*,_std::allocator<IContainedElement_*>_> *)&__range1,
             this->container_);
  __end1 = std::vector<IContainedElement_*,_std::allocator<IContainedElement_*>_>::begin
                     ((vector<IContainedElement_*,_std::allocator<IContainedElement_*>_> *)&__range1
                     );
  list_of_element =
       (IContainedElement **)
       std::vector<IContainedElement_*,_std::allocator<IContainedElement_*>_>::end
                 ((vector<IContainedElement_*,_std::allocator<IContainedElement_*>_> *)&__range1);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<IContainedElement_**,_std::vector<IContainedElement_*,_std::allocator<IContainedElement_*>_>_>
                                     *)&list_of_element), bVar1) {
    ppIStack_48 = __gnu_cxx::
                  __normal_iterator<IContainedElement_**,_std::vector<IContainedElement_*,_std::allocator<IContainedElement_*>_>_>
                  ::operator*(&__end1);
    local_4c = (*(*ppIStack_48)->_vptr_IContainedElement[2])();
    switch(local_4c) {
    case 1:
      pIVar2 = (value_type)operator_new(0x10);
      Snapshot::Snapshot((Snapshot *)pIVar2,local_4c);
      local_80 = pIVar2;
      std::vector<IMedia_*,_std::allocator<IMedia_*>_>::push_back(&this->media_list_,&local_80);
      break;
    default:
      break;
    case 3:
      this_00 = (Disk *)operator_new(0x38);
      Disk::Disk(this_00,local_4c,*ppIStack_48);
      local_68[0] = this_00;
      std::vector<IMedia_*,_std::allocator<IMedia_*>_>::push_back
                (&this->media_list_,(value_type *)local_68);
      break;
    case 4:
      pIVar2 = (value_type)operator_new(0x10);
      Tape::Tape((Tape *)pIVar2,local_4c);
      local_70 = pIVar2;
      std::vector<IMedia_*,_std::allocator<IMedia_*>_>::push_back(&this->media_list_,&local_70);
      break;
    case 5:
      pIVar2 = (value_type)operator_new(0x10);
      SnapshotReplay::SnapshotReplay((SnapshotReplay *)pIVar2,local_4c);
      local_88 = pIVar2;
      std::vector<IMedia_*,_std::allocator<IMedia_*>_>::push_back(&this->media_list_,&local_88);
      break;
    case 6:
      pIVar2 = (value_type)operator_new(0x10);
      Binary::Binary((Binary *)pIVar2,local_4c);
      local_78 = pIVar2;
      std::vector<IMedia_*,_std::allocator<IMedia_*>_>::push_back(&this->media_list_,&local_78);
      break;
    case 8:
      pIVar2 = (value_type)operator_new(0x10);
      CPR::CPR((CPR *)pIVar2,local_4c);
      local_90 = pIVar2;
      std::vector<IMedia_*,_std::allocator<IMedia_*>_>::push_back(&this->media_list_,&local_90);
    }
    __gnu_cxx::
    __normal_iterator<IContainedElement_**,_std::vector<IContainedElement_*,_std::allocator<IContainedElement_*>_>_>
    ::operator++(&__end1);
  }
  std::vector<IContainedElement_*,_std::allocator<IContainedElement_*>_>::~vector
            ((vector<IContainedElement_*,_std::allocator<IContainedElement_*>_> *)&__range1);
  return;
}

Assistant:

void MediaManager::Init()
{
   ClearList();

   std::vector<IContainedElement*> list_of_elements = container_->GetFileList();

   // Check buffer :
   for (auto& list_of_element : list_of_elements)
   {
      const int type = list_of_element->GetType();

      // Add a media type
      switch (type)
      {
      case MEDIA_DISK:
         media_list_.push_back(new Disk(type, list_of_element));
         break;
      case MEDIA_TAPE:
         media_list_.push_back(new Tape(type));
         break;
      case MEDIA_BIN:
         media_list_.push_back(new Binary(type));
         break;
      case MEDIA_SNA:
         media_list_.push_back(new Snapshot(type));
         break;
      case MEDIA_SNR:
         media_list_.push_back(new SnapshotReplay(type));
         break;
      case MEDIA_CPR:
         media_list_.push_back(new CPR(type));
         break;
      default: // unhandled type
         break;
      }
   }
}